

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall DIntermissionScreenFader::Drawer(DIntermissionScreenFader *this)

{
  uint uVar1;
  FIIntermissionPatch *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FTexture *pFVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double local_38;
  
  if (((this->super_DIntermissionScreen).mFlatfill != false) ||
     ((this->super_DIntermissionScreen).mBackground.texnum < 1)) {
    return;
  }
  dVar9 = (double)(this->super_DIntermissionScreen).mTicker /
          (double)*(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24;
  if (1.0 <= dVar9) {
    dVar9 = 1.0;
  }
  local_38 = 0.0;
  if (0.0 <= dVar9) {
    local_38 = dVar9;
  }
  if (this->mType == FADE_In) {
    local_38 = 1.0 - local_38;
  }
  iVar4 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
  if ((char)iVar4 == '\0') {
    V_SetBlend(0,0,0,(int)(local_38 * 256.0));
    DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
    return;
  }
  uVar5 = (int)(local_38 * 255.0) << 0x18;
  uVar1 = (this->super_DIntermissionScreen).mBackground.texnum;
  if (uVar1 < TexMan.Textures.Count) {
    pFVar6 = TexMan.Textures.Array[(int)uVar1].Texture;
  }
  else {
    pFVar6 = (FTexture *)0x0;
  }
  DCanvas::DrawTexture((DCanvas *)screen,pFVar6,0.0,0.0,0x400013ae,1,0x400013aa,(ulong)uVar5,0);
  if ((this->super_DIntermissionScreen).mOverlays.Count != 0) {
    lVar7 = 0x10;
    uVar8 = 0;
    do {
      bVar3 = DIntermissionScreen::CheckOverlay(&this->super_DIntermissionScreen,(int)uVar8);
      if (bVar3) {
        pFVar2 = (this->super_DIntermissionScreen).mOverlays.Array;
        uVar1 = *(uint *)((long)pFVar2 + lVar7 + -0xc);
        if (uVar1 < TexMan.Textures.Count) {
          pFVar6 = TexMan.Textures.Array[(int)uVar1].Texture;
        }
        else {
          pFVar6 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar6,*(double *)((long)pFVar2 + lVar7 + -8),
                   *(double *)((long)&(pFVar2->mCondition).Index + lVar7),0x40001391,1,0x400013aa,
                   (ulong)uVar5,0);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < (this->super_DIntermissionScreen).mOverlays.Count);
  }
  DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  return;
}

Assistant:

void DIntermissionScreenFader::Drawer ()
{
	if (!mFlatfill && mBackground.isValid())
	{
		double factor = clamp(double(mTicker) / mDuration, 0., 1.);
		if (mType == FADE_In) factor = 1.0 - factor;
		int color = MAKEARGB(int(factor*255), 0,0,0);

		if (screen->Begin2D(false))
		{
			screen->DrawTexture (TexMan[mBackground], 0, 0, DTA_Fullscreen, true, DTA_ColorOverlay, color, TAG_DONE);
			for (unsigned i=0; i < mOverlays.Size(); i++)
			{
				if (CheckOverlay(i))
					screen->DrawTexture (TexMan[mOverlays[i].mPic], mOverlays[i].x, mOverlays[i].y, DTA_320x200, true, DTA_ColorOverlay, color, TAG_DONE);
			}
			screen->FillBorder (NULL);
		}
		else
		{
			V_SetBlend (0,0,0,int(256*factor));
			Super::Drawer();
		}
	}
}